

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void printHex(uchar *value,int len)

{
  size_t sVar1;
  int local_2c;
  char local_27;
  char local_26;
  int i;
  char buf [3];
  char *pcStack_20;
  int strl;
  char *data;
  int len_local;
  uchar *value_local;
  
  pcStack_20 = ByteToHex(value,len);
  sVar1 = strlen(pcStack_20);
  i = (int)(sVar1 >> 1);
  memset(&local_27,0,3);
  for (local_2c = 0; local_2c < i; local_2c = local_2c + 1) {
    local_27 = pcStack_20[local_2c << 1];
    local_26 = pcStack_20[local_2c * 2 + 1];
    printf("%s ",&local_27);
  }
  printf("\n");
  if (pcStack_20 != (char *)0x0) {
    operator_delete__(pcStack_20);
  }
  return;
}

Assistant:

void printHex(const unsigned char* value, const int len)
{
	char* data = ByteToHex(value, len);
	int strl = strlen(data) / 2;
	char buf[3] = { 0 };
	for (int i = 0; i < strl; ++i)
	{
		buf[0] = data[i * 2];
		buf[1] = data[i * 2 + 1];
		printf("%s ", buf);
	}
	printf("\n");
	delete[]data;
}